

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O1

size_t bakeBSTS_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  ulong n_00;
  size_t sVar12;
  
  sVar1 = ecpIsOnA_deep(n,f_deep);
  sVar1 = utilMax(2,f_deep,sVar1);
  sVar2 = ecMulA_deep(n,ec_d,ec_deep,n);
  sVar2 = utilMax(2,f_deep,sVar2);
  sVar3 = ecpIsOnA_deep(n,f_deep);
  sVar4 = ecMulA_deep(n,ec_d,ec_deep,n);
  sVar5 = beltHash_keep();
  n_00 = n >> 1;
  sVar6 = zzMul_deep(n_00,n);
  sVar12 = n + n_00 + 1;
  sVar7 = zzMod_deep(sVar12,n);
  sVar8 = beltKRP_keep();
  sVar9 = beltCFB_keep();
  sVar10 = beltMAC_keep();
  sVar3 = utilMax(9,f_deep,sVar3,sVar4,sVar5,sVar6,sVar7,sVar8,sVar9,sVar10);
  sVar4 = ecpIsOnA_deep(n,f_deep);
  sVar5 = ecMulA_deep(n,ec_d,ec_deep,n);
  sVar6 = beltHash_keep();
  sVar7 = zzMul_deep(n_00,n);
  sVar8 = zzMod_deep(sVar12,n);
  sVar9 = ecAddMulA_deep(n,ec_d,ec_deep,2,n,n_00 + 1);
  sVar10 = beltKRP_keep();
  sVar12 = beltCFB_keep();
  sVar11 = beltMAC_keep();
  sVar4 = utilMax(10,f_deep,sVar4,sVar5,sVar6,sVar7,sVar8,sVar9,sVar10,sVar12,sVar11);
  sVar5 = beltMAC_keep();
  sVar6 = beltCFB_keep();
  sVar7 = ecpIsOnA_deep(n,f_deep);
  sVar8 = ecAddMulA_deep(n,ec_d,ec_deep,2,n,n_00 + 1);
  sVar5 = utilMax(5,sVar5,sVar6,f_deep,sVar7,sVar8);
  sVar1 = utilMax(5,sVar1,sVar2,sVar3 + n * 0x20 + 0x30,n * 0x30 + sVar4 + 0x30,sVar5 + n * 0x18);
  return sVar1;
}

Assistant:

static size_t bakeBSTS_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return utilMax(5,
		bakeBSTSStart_deep(n, f_deep, ec_d, ec_deep),
		bakeBSTSStep2_deep(n, f_deep, ec_d, ec_deep),
		bakeBSTSStep3_deep(n, f_deep, ec_d, ec_deep),
		bakeBSTSStep4_deep(n, f_deep, ec_d, ec_deep),
		bakeBSTSStep5_deep(n, f_deep, ec_d, ec_deep));
}